

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  byte bVar1;
  int iVar2;
  RepeatedPtrFieldBase *this_00;
  Rep *pRVar3;
  Extension *pEVar4;
  LogMessage *pLVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *obj;
  string *psVar7;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar8;
  LogFinisher local_d1;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  pVar8 = Insert(this,number);
  pEVar4 = pVar8.first;
  pEVar4->descriptor = descriptor;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar4->is_repeated == false) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x265);
      pLVar5 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_98,pLVar5);
      LogMessage::~LogMessage(&local_d0);
    }
    bVar1 = pEVar4->type;
    if ((byte)(bVar1 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar5 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar5);
      LogMessage::~LogMessage(&local_98);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x265);
      pLVar5 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_d1,pLVar5);
      LogMessage::~LogMessage(&local_60);
    }
  }
  else {
    pEVar4->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x3f);
      pLVar5 = LogMessage::operator<<
                         (&local_98,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_d0,pLVar5);
      LogMessage::~LogMessage(&local_98);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 9) {
      LogMessage::LogMessage
                (&local_d0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x25f);
      pLVar5 = LogMessage::operator<<
                         (&local_d0,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_60,pLVar5);
      LogMessage::~LogMessage(&local_d0);
    }
    pEVar4->is_repeated = true;
    pEVar4->is_packed = false;
    pRVar6 = Arena::CreateMessageInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                       (this->arena_);
    (pEVar4->field_0).repeated_string_value = pRVar6;
  }
  this_00 = &((pEVar4->field_0).repeated_string_value)->super_RepeatedPtrFieldBase;
  pRVar3 = this_00->rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar2 = this_00->current_size_;
    if (iVar2 < pRVar3->allocated_size) {
      this_00->current_size_ = iVar2 + 1;
      return (string *)pRVar3->elements[iVar2];
    }
  }
  obj = Arena::Create<std::__cxx11::string>(this_00->arena_);
  psVar7 = (string *)RepeatedPtrFieldBase::AddOutOfLineHelper(this_00,obj);
  return psVar7;
}

Assistant:

std::string* ExtensionSet::AddString(int number, FieldType type,
                                     const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_packed = false;
    extension->repeated_string_value =
        Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  }
  return extension->repeated_string_value->Add();
}